

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

int8_t mpack_expect_i8(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  mpack_tag_t mVar2;
  
  mVar2 = mpack_read_tag(reader);
  aVar1 = mVar2.v;
  if (mVar2.type == mpack_type_int) {
    if ((long)mVar2.v._0_1_ == aVar1.u) goto LAB_001067ce;
  }
  else if ((mVar2.type == mpack_type_uint) && (aVar1.u < 0x80)) goto LAB_001067ce;
  mpack_reader_flag_error(reader,mpack_error_type);
  aVar1.u = 0;
LAB_001067ce:
  return aVar1.ext.exttype;
}

Assistant:

int8_t mpack_expect_i8(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint) {
        if (var.v.u <= INT8_MAX)
            return (int8_t)var.v.u;
    } else if (var.type == mpack_type_int) {
        if (var.v.i >= INT8_MIN && var.v.i <= INT8_MAX)
            return (int8_t)var.v.i;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}